

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg2.cc
# Opt level: O3

void __thiscall trng::mrg2::seed(mrg2 *this,result_type s1,result_type s2)

{
  int iVar1;
  int iVar2;
  
  iVar1 = s1 + ((int)((long)s1 * 0x40000001 >> 0x3d) - (s1 >> 0x1f)) * -0x7fffffff;
  iVar2 = iVar1 + 0x7fffffff;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  (this->S).r[0] = iVar2;
  iVar2 = (int)((long)s2 * 0x40000001 >> 0x3d) - (s2 >> 0x1f);
  iVar1 = iVar2 * -0x80000000 + s2 + iVar2;
  iVar2 = iVar1 + 0x7fffffff;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  (this->S).r[1] = iVar2;
  return;
}

Assistant:

void mrg2::seed(mrg2::result_type s1, mrg2::result_type s2) {
    S.r[0] = s1 % modulus;
    if (S.r[0] < 0)
      S.r[0] += modulus;
    S.r[1] = s2 % modulus;
    if (S.r[1] < 0)
      S.r[1] += modulus;
  }